

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O2

void __thiscall
DatabaseSnapshot::read_iterator
          (DatabaseSnapshot *this,Task *task,string *iterator_id,int count,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *out,uint64_t *out_iterator_position,uint64_t *out_iterator_files)

{
  const_iterator cVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string param;
  string file_offset;
  string byte_offset;
  DBChange local_1d8;
  OnDiskIterator iterator_copy;
  
  *out_iterator_files = 0;
  *out_iterator_position = 0;
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OnDiskIterator>_>_>
          ::find(&(this->iterators)._M_t,iterator_id);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->iterators)._M_t._M_impl.super__Rb_tree_header) {
    OnDiskIterator::OnDiskIterator(&iterator_copy,(OnDiskIterator *)(cVar1._M_node + 2));
    OnDiskIterator::pop(&iterator_copy,count,out);
    *out_iterator_files = iterator_copy.total_files;
    *out_iterator_position = iterator_copy.file_offset;
    std::__cxx11::to_string(&byte_offset,iterator_copy.byte_offset);
    std::__cxx11::to_string(&file_offset,iterator_copy.file_offset);
    std::operator+(&local_258,&byte_offset,":");
    std::operator+(&param,&local_258,&file_offset);
    std::__cxx11::string::~string((string *)&local_258);
    local_258._M_dataplus._M_p._0_4_ = 6;
    DBChange::DBChange(&local_1d8,(DbChangeType *)&local_258,&iterator_copy.name.filename,&param);
    std::vector<DBChange,_std::allocator<DBChange>_>::emplace_back<DBChange>
              (&task->changes_,&local_1d8);
    DBChange::~DBChange(&local_1d8);
    std::__cxx11::string::~string((string *)&param);
    std::__cxx11::string::~string((string *)&file_offset);
    std::__cxx11::string::~string((string *)&byte_offset);
    OnDiskIterator::~OnDiskIterator(&iterator_copy);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"tried to read non-existent iterator");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DatabaseSnapshot::read_iterator(Task *task, const std::string &iterator_id,
                                     int count, std::vector<std::string> *out,
                                     uint64_t *out_iterator_position,
                                     uint64_t *out_iterator_files) const {
    *out_iterator_files = 0;
    *out_iterator_position = 0;

    auto it = iterators.find(iterator_id);
    if (it == iterators.end()) {
        throw std::runtime_error("tried to read non-existent iterator");
    }

    OnDiskIterator iterator_copy = it->second;
    iterator_copy.pop(count, out);
    *out_iterator_files = iterator_copy.get_total_files();
    *out_iterator_position = iterator_copy.get_file_offset();

    std::string byte_offset = std::to_string(iterator_copy.get_byte_offset());
    std::string file_offset = std::to_string(iterator_copy.get_file_offset());
    std::string param = byte_offset + ":" + file_offset;
    task->change(DBChange(DbChangeType::UpdateIterator,
                          iterator_copy.get_name().get_filename(), param));
}